

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

bool __thiscall front::syntax::SyntaxAnalyze::match_one_word(SyntaxAnalyze *this,Token tk)

{
  _func_int **pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pWVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  ostream *poVar10;
  undefined8 uVar11;
  pthread_mutex_t *__mutex;
  _Alloc_hider _Var12;
  size_type __dnew;
  string local_138;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  uint local_e0 [4];
  size_t local_d0;
  bool local_c8;
  _func_int *local_c0;
  size_type local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  pthread_mutex_t *local_a0;
  undefined **local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 local_70;
  string local_68;
  Timestamp local_48;
  
  uVar7 = this->matched_index + 1;
  pWVar3 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pWVar3 >> 4) *
             -0x5555555555555555) <= uVar7) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
                  ,0x665,"bool front::syntax::SyntaxAnalyze::match_one_word(Token)");
  }
  bVar5 = word::Word::match_token(pWVar3 + uVar7,tk);
  if (!bVar5) {
    return bVar5;
  }
  if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) != 0) &&
     (plVar8 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                               *(long *)(std::clog + -0x18)),
                                      &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
     plVar8 != (long *)0x0)) {
    __mutex = (pthread_mutex_t *)(plVar8 + 0x29);
    iVar6 = pthread_mutex_lock(__mutex);
    if (iVar6 == 0) {
      if ((char)plVar8[0x10] != '\0') {
        local_a0 = __mutex;
        (**(code **)(*plVar8 + 0x30))(plVar8);
        *(undefined1 *)(plVar8 + 0x10) = 0;
        plVar8[0x23] = 0;
        *(undefined1 *)(plVar8 + 0x24) = 1;
        local_118._0_8_ = &PTR__Tag_001eaf88;
        local_118._16_8_ = (_func_int *)0x0;
        local_100._M_allocated_capacity = local_100._M_allocated_capacity & 0xffffffffffffff00;
        local_f0._M_p._0_1_ = 1;
        local_118._8_8_ = &local_100;
        std::__cxx11::string::_M_assign((string *)(plVar8 + 0x12));
        *(undefined1 *)(plVar8 + 0x16) = local_f0._M_p._0_1_;
        local_118._0_8_ = &PTR__Tag_001eaf88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._8_8_ != &local_100) {
          operator_delete((void *)local_118._8_8_,local_100._M_allocated_capacity + 1);
        }
        __mutex = local_a0;
        AixLog::Function::Function((Function *)local_118,(nullptr_t)0x0);
        std::__cxx11::string::_M_assign((string *)(plVar8 + 0x18));
        std::__cxx11::string::_M_assign((string *)(plVar8 + 0x1c));
        *(bool *)(plVar8 + 0x21) = local_c8;
        plVar8[0x20] = local_d0;
        AixLog::Function::~Function((Function *)local_118);
        *(undefined1 *)(plVar8 + 0x25) = 1;
      }
      pthread_mutex_unlock(__mutex);
      goto LAB_0019ed56;
    }
    iVar6 = std::__throw_system_error(iVar6);
LAB_0019f211:
    iVar6 = std::__throw_system_error(iVar6);
LAB_0019f218:
    iVar6 = std::__throw_system_error(iVar6);
LAB_0019f21f:
    uVar11 = std::__throw_system_error(iVar6);
    pthread_mutex_unlock(local_a0);
    _Unwind_Resume(uVar11);
  }
  pp_Var1 = (_func_int **)(local_118 + 0x10);
  local_118._16_6_ = 0x6563617254;
  local_118._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x5;
  local_118._0_8_ = pp_Var1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,(char *)pp_Var1,5);
  if ((_func_int **)local_118._0_8_ != pp_Var1) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
LAB_0019ed56:
  local_90 = &local_80;
  local_98 = &PTR__Tag_001eaf88;
  local_88 = 0;
  local_80 = 0;
  local_70 = 1;
  if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) != 0) &&
     (lVar9 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                      *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                             &AixLog::Log::typeinfo,0), lVar9 != 0)) {
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar9 + 0x148));
    if (iVar6 != 0) goto LAB_0019f211;
    std::__cxx11::string::_M_assign((string *)(lVar9 + 0x90));
    *(undefined1 *)(lVar9 + 0xb0) = local_70;
    pthread_mutex_unlock((pthread_mutex_t *)(lVar9 + 0x148));
  }
  local_48.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_48._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001eaf58;
  local_48.is_null_ = false;
  if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) ||
     (lVar9 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                      *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                             &AixLog::Log::typeinfo,0), lVar9 == 0)) {
    local_c0 = (_func_int *)0x15;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_c0);
    local_138.field_2._M_allocated_capacity = (size_type)local_c0;
    builtin_strncpy(local_138._M_dataplus._M_p,"%Y-%m-%d %H-%M-%S.#ms",0x15);
    local_138._M_string_length = (size_type)local_c0;
    local_138._M_dataplus._M_p[(long)local_c0] = '\0';
    AixLog::Timestamp::to_string((string *)local_118,&local_48,&local_138);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,(char *)local_118._0_8_,local_118._8_8_);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar9 + 0x148));
    if (iVar6 != 0) goto LAB_0019f218;
    *(bool *)(lVar9 + 0x120) = local_48.is_null_;
    ((duration *)(lVar9 + 0x118))->__r = (rep)local_48.time_point.__d.__r;
    pthread_mutex_unlock((pthread_mutex_t *)(lVar9 + 0x148));
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"match_one_word","");
  local_c0 = (_func_int *)&local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
             ,"");
  sVar4 = local_138._M_string_length;
  local_118._0_8_ = &PTR__Function_001eafb8;
  paVar2 = &local_138.field_2;
  _Var12._M_p = local_138._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar2) {
    local_100._8_4_ = local_138.field_2._8_4_;
    local_100._12_4_ = local_138.field_2._12_4_;
    _Var12._M_p = (pointer)&local_100;
  }
  local_100._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
  local_f0._M_p = (pointer)local_e0;
  local_118._16_8_ = local_138._M_string_length;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity =
       local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_c0 == (_func_int *)&local_b0) {
    local_e0[2] = uStack_a8;
    local_e0[3] = uStack_a4;
  }
  else {
    local_f0._M_p = (pointer)local_c0;
  }
  local_e8 = local_b8;
  local_b8 = 0;
  local_b0 = local_b0 & 0xffffff00;
  local_d0 = 0x660;
  local_c8 = false;
  local_138._M_dataplus._M_p = (pointer)paVar2;
  local_118._8_8_ = _Var12._M_p;
  local_c0 = (_func_int *)&local_b0;
  if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) ||
     (lVar9 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                      *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                             &AixLog::Log::typeinfo,0), lVar9 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,_Var12._M_p,sVar4);
  }
  else {
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar9 + 0x148));
    if (iVar6 != 0) goto LAB_0019f21f;
    std::__cxx11::string::_M_assign((string *)(lVar9 + 0xc0));
    std::__cxx11::string::_M_assign((string *)(lVar9 + 0xe0));
    *(bool *)(lVar9 + 0x108) = local_c8;
    *(size_t *)(lVar9 + 0x100) = local_d0;
    pthread_mutex_unlock((pthread_mutex_t *)(lVar9 + 0x148));
  }
  word::Word::get_self_abi_cxx11_
            (&local_68,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index + 1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  AixLog::Function::~Function((Function *)local_118);
  if (local_c0 != (_func_int *)&local_b0) {
    operator_delete(local_c0,CONCAT44(uStack_ac,local_b0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_98 = &PTR__Tag_001eaf88;
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  this->matched_index = this->matched_index + 1;
  return bVar5;
}

Assistant:

bool SyntaxAnalyze::match_one_word(Token tk) {
  bool return_value = false;
  if (matched_index + 1 < word_list.size()) {
    if (word_list[matched_index + 1].match_token(tk)) {
      LOG(TRACE) << word_list[matched_index + 1].get_self() << std::endl;
      matched_index++;
      return_value = true;
    }
  } else {
    assert(false);
  }
  return return_value;
}